

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall
ThreadPoolTest_initialSizeDefined_Test::TestBody(ThreadPoolTest_initialSizeDefined_Test *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  thread_pool pool;
  uint local_158 [2];
  long *local_150;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  thread_pool local_138 [304];
  
  jessilib::thread_pool::thread_pool(local_138,7);
  local_150 = (long *)jessilib::thread_pool::threads();
  local_158[0] = 7;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_148,"pool.threads()","7U",(unsigned_long *)&local_150,local_158);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_150 != (long *)0x0) {
      (**(code **)(*local_150 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_148 = (undefined1  [8])0x0;
  local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00989680;
  do {
    iVar1 = nanosleep((timespec *)local_148,(timespec *)local_148);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_150 = (long *)jessilib::thread_pool::active();
  local_158[0] = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_148,"pool.active()","0U",(unsigned_long *)&local_150,local_158);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_150 != (long *)0x0) {
      (**(code **)(*local_150 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  jessilib::thread_pool::join();
  local_150 = (long *)jessilib::thread_pool::active();
  local_158[0] = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_148,"pool.active()","0U",(unsigned_long *)&local_150,local_158);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_150 != (long *)0x0) {
      (**(code **)(*local_150 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_150 = (long *)jessilib::thread_pool::threads();
  local_158[0] = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_148,"pool.threads()","0U",(unsigned_long *)&local_150,local_158);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_150 != (long *)0x0) {
      (**(code **)(*local_150 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  jessilib::thread_pool::~thread_pool(local_138);
  return;
}

Assistant:

TEST(ThreadPoolTest, initialSizeDefined) {
	thread_pool pool{ 7 };

	EXPECT_EQ(pool.threads(), 7U);
	std::this_thread::sleep_for(10ms);
	EXPECT_EQ(pool.active(), 0U);

	pool.join();

	EXPECT_EQ(pool.active(), 0U);
	EXPECT_EQ(pool.threads(), 0U);
}